

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSFunctionDef *
js_new_function_def(JSContext *ctx,JSFunctionDef *parent,BOOL is_eval,BOOL is_func_expr,
                   char *filename,int line_num)

{
  JSAtom JVar1;
  BOOL in_ECX;
  BOOL in_EDX;
  JSFunctionDef *in_RSI;
  JSContext *in_RDI;
  char *in_R8;
  int in_R9D;
  JSFunctionDef *fd;
  undefined4 in_stack_ffffffffffffffd0;
  JSFunctionDef *local_8;
  
  local_8 = (JSFunctionDef *)js_mallocz((JSContext *)in_RSI,CONCAT44(in_EDX,in_ECX));
  if (local_8 == (JSFunctionDef *)0x0) {
    local_8 = (JSFunctionDef *)0x0;
  }
  else {
    local_8->ctx = in_RDI;
    init_list_head(&local_8->child_list);
    local_8->parent = in_RSI;
    local_8->parent_cpool_idx = -1;
    if (in_RSI != (JSFunctionDef *)0x0) {
      list_add_tail((list_head *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),(list_head *)local_8);
      local_8->js_mode = in_RSI->js_mode;
      local_8->parent_scope_level = in_RSI->scope_level;
    }
    local_8->is_eval = in_EDX;
    local_8->is_func_expr = in_ECX;
    js_dbuf_init((JSContext *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),(DynBuf *)local_8);
    local_8->last_opcode_pos = -1;
    local_8->func_name = 0;
    local_8->var_object_idx = -1;
    local_8->arg_var_object_idx = -1;
    local_8->arguments_var_idx = -1;
    local_8->arguments_arg_idx = -1;
    local_8->func_var_idx = -1;
    local_8->eval_ret_idx = -1;
    local_8->this_var_idx = -1;
    local_8->new_target_var_idx = -1;
    local_8->this_active_func_var_idx = -1;
    local_8->home_object_var_idx = -1;
    local_8->scopes = local_8->def_scope_array;
    local_8->scope_size = 4;
    local_8->scope_count = 1;
    local_8->scopes->first = -1;
    local_8->scopes->parent = -1;
    local_8->scope_level = 0;
    local_8->scope_first = -1;
    local_8->body_scope = -1;
    JVar1 = JS_NewAtom((JSContext *)CONCAT44(in_EDX,in_ECX),in_R8);
    local_8->filename = JVar1;
    local_8->line_num = in_R9D;
    js_dbuf_init((JSContext *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),(DynBuf *)local_8);
    local_8->last_opcode_line_num = in_R9D;
  }
  return local_8;
}

Assistant:

static JSFunctionDef *js_new_function_def(JSContext *ctx,
                                          JSFunctionDef *parent,
                                          BOOL is_eval,
                                          BOOL is_func_expr,
                                          const char *filename, int line_num)
{
    JSFunctionDef *fd;

    fd = js_mallocz(ctx, sizeof(*fd));
    if (!fd)
        return NULL;

    fd->ctx = ctx;
    init_list_head(&fd->child_list);

    /* insert in parent list */
    fd->parent = parent;
    fd->parent_cpool_idx = -1;
    if (parent) {
        list_add_tail(&fd->link, &parent->child_list);
        fd->js_mode = parent->js_mode;
        fd->parent_scope_level = parent->scope_level;
    }

    fd->is_eval = is_eval;
    fd->is_func_expr = is_func_expr;
    js_dbuf_init(ctx, &fd->byte_code);
    fd->last_opcode_pos = -1;
    fd->func_name = JS_ATOM_NULL;
    fd->var_object_idx = -1;
    fd->arg_var_object_idx = -1;
    fd->arguments_var_idx = -1;
    fd->arguments_arg_idx = -1;
    fd->func_var_idx = -1;
    fd->eval_ret_idx = -1;
    fd->this_var_idx = -1;
    fd->new_target_var_idx = -1;
    fd->this_active_func_var_idx = -1;
    fd->home_object_var_idx = -1;

    /* XXX: should distinguish arg, var and var object and body scopes */
    fd->scopes = fd->def_scope_array;
    fd->scope_size = countof(fd->def_scope_array);
    fd->scope_count = 1;
    fd->scopes[0].first = -1;
    fd->scopes[0].parent = -1;
    fd->scope_level = 0;  /* 0: var/arg scope */
    fd->scope_first = -1;
    fd->body_scope = -1;

    fd->filename = JS_NewAtom(ctx, filename);
    fd->line_num = line_num;

    js_dbuf_init(ctx, &fd->pc2line);
    //fd->pc2line_last_line_num = line_num;
    //fd->pc2line_last_pc = 0;
    fd->last_opcode_line_num = line_num;

    return fd;
}